

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O3

void op_addReg(MCInst *MI,int reg)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x3e;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    pcVar2 = MI->flat_insn->detail;
    *(int *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46) = reg;
    pcVar2 = MI->flat_insn->detail;
    pcVar2->groups[(ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x5e] =
         MI->csh->regsize_map[reg];
    puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  if (MI->op1_size != '\0') {
    return;
  }
  MI->op1_size = MI->csh->regsize_map[reg];
  return;
}

Assistant:

void op_addReg(MCInst *MI, int reg)
{
	if (MI->csh->detail) {
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_REG;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].reg = reg;
		MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].size = MI->csh->regsize_map[reg];
		MI->flat_insn->detail->x86.op_count++;
	}

	if (MI->op1_size == 0)
		MI->op1_size = MI->csh->regsize_map[reg];
}